

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  lu_byte lVar1;
  Vardesc *pVVar2;
  TString *pTVar3;
  FuncState *pFVar4;
  uint uVar5;
  uint uVar6;
  BlockCnt *pBVar7;
  Upvaldesc *pUVar8;
  lu_byte *plVar9;
  expdesc *peVar10;
  ulong uVar11;
  int iVar12;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    iVar12 = 0;
    var->k = VVOID;
  }
  else {
    peVar10 = var;
    uVar6 = (uint)fs->nactvar;
    do {
      uVar5 = uVar6 - 1;
      if ((int)uVar6 < 1) {
        iVar12 = -1;
        break;
      }
      pVVar2 = (fs->ls->dyd->actvar).arr;
      iVar12 = fs->firstlocal + uVar5;
      pTVar3 = *(TString **)((long)pVVar2 + (long)iVar12 * 0x18 + 0x10);
      if (pTVar3 == n) {
        lVar1 = (&pVVar2->vd)[iVar12].kind;
        var->t = -1;
        var->f = -1;
        if (lVar1 == '\x03') {
          var->k = VCONST;
          (var->u).info = iVar12;
        }
        else {
          var->k = VLOCAL;
          (var->u).var.vidx = (unsigned_short)uVar5;
          (var->u).var.ridx =
               *(lu_byte *)
                ((long)(fs->ls->dyd->actvar).arr + (long)(int)(fs->firstlocal + uVar5) * 0x18 + 10);
        }
        peVar10 = (expdesc *)(ulong)var->k;
      }
      iVar12 = (int)peVar10;
      uVar6 = uVar5;
    } while (pTVar3 != n);
    if (-1 < iVar12) {
      if (base != 0 || iVar12 != 9) {
        return;
      }
      pBVar7 = (BlockCnt *)&fs->bl;
      do {
        pBVar7 = pBVar7->previous;
      } while ((var->u).var.vidx < (ushort)pBVar7->nactvar);
      pBVar7->upval = '\x01';
      fs->needclose = '\x01';
      return;
    }
    iVar12 = -1;
    if ((ulong)fs->nups != 0) {
      pUVar8 = fs->f->upvalues;
      uVar11 = 0;
      do {
        if (pUVar8->name == n) {
          iVar12 = (int)uVar11;
          break;
        }
        uVar11 = uVar11 + 1;
        pUVar8 = pUVar8 + 1;
      } while (fs->nups != uVar11);
    }
    if (iVar12 < 0) {
      singlevaraux(fs->prev,n,var,0);
      if (1 < var->k - VLOCAL) {
        return;
      }
      pUVar8 = allocupvalue(fs);
      pFVar4 = fs->prev;
      if (var->k == VLOCAL) {
        pUVar8->instack = '\x01';
        pUVar8->idx = (var->u).var.ridx;
        plVar9 = &(&((pFVar4->ls->dyd->actvar).arr)->vd)
                  [(long)pFVar4->firstlocal + (ulong)(var->u).var.vidx].kind;
      }
      else {
        pUVar8->instack = '\0';
        pUVar8->idx = (var->u).var.ridx;
        plVar9 = &pFVar4->f->upvalues[(var->u).info].kind;
      }
      pUVar8->kind = *plVar9;
      pUVar8->name = n;
      if (((fs->f->marked & 0x20) != 0) && ((n->marked & 0x18) != 0)) {
        luaC_barrier_(fs->ls->L,(GCObject *)fs->f,(GCObject *)n);
      }
      iVar12 = fs->nups - 1;
    }
    var->t = -1;
    var->f = -1;
    var->k = VUPVAL;
  }
  (var->u).info = iVar12;
  return;
}

Assistant:

static void singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    init_exp(var, VVOID, 0);  /* default is global */
  else {
    int v = searchvar(fs, n, var);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      if (v == VLOCAL && !base)
        markupval(fs, var->u.var.vidx);  /* local will be used as an upval */
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
        if (var->k == VLOCAL || var->k == VUPVAL)  /* local or upvalue? */
          idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
        else  /* it is a global or a constant */
          return;  /* don't need to do anything at this level */
      }
      init_exp(var, VUPVAL, idx);  /* new or old upvalue */
    }
  }
}